

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O1

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  ulong uVar4;
  ssize_t sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = this->offset;
  if (uVar4 < (ulong)(((long)this->last - (long)this->first) * 8)) {
    uVar8 = 8 - ((uint)uVar4 & 7);
    this->streamError = NoError;
    uVar9 = ~(-1 << ((byte)uVar8 & 0x1f));
    uVar6 = this->first[uVar4 >> 3] & uVar9;
    if (uVar6 < uVar9) {
      *(uint *)CONCAT44(in_register_00000034,__fd) = uVar6;
      uVar4 = uVar4 + uVar8;
    }
    else {
      uVar8 = uVar8 + (uint)uVar4;
      iVar7 = 0;
      do {
        if ((ulong)(((long)this->last - (long)this->first) * 8) <= (ulong)uVar8) goto LAB_001db589;
        bVar1 = this->first[uVar8 >> 3];
        if ((iVar7 == 0x1c) && (0xf < bVar1)) {
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_40 = "default";
          QMessageLogger::critical(local_58,"integer is too big");
          this->streamError = InvalidInteger;
          cVar3 = '\x01';
          iVar2 = 0x1c;
        }
        else {
          uVar6 = uVar6 + ((bVar1 & 0x7f) << ((byte)iVar7 & 0x1f));
          uVar8 = uVar8 + 8;
          cVar3 = (-1 < (char)bVar1) * '\x03';
          iVar2 = iVar7 + 7;
          if (-1 < (char)bVar1) {
            iVar2 = iVar7;
          }
        }
        iVar7 = iVar2;
      } while (cVar3 == '\0');
      if (cVar3 != '\x03') goto LAB_001db590;
      *(uint *)CONCAT44(in_register_00000034,__fd) = uVar6;
      uVar4 = (ulong)uVar8;
    }
    this->offset = uVar4;
    sVar5 = CONCAT71((int7)(uVar4 >> 8),1);
  }
  else {
LAB_001db589:
    this->streamError = NotEnoughData;
LAB_001db590:
    sVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar5;
}

Assistant:

bool BitIStream::read(quint32 *dstPtr)
{
    Q_ASSERT(dstPtr);
    quint32 &dst = *dstPtr;

    // 5.1 Integer Representation
    //
    // Integers are used to represent name indexes, header field indexes, or string lengths.
    // An integer representation can start anywhere within an octet.
    // To allow for optimized processing, an integer representation always finishes at the end of an octet.
    // An integer is represented in two parts: a prefix that fills the current octet and an optional
    // list of octets that are used if the integer value does not fit within the prefix.
    // The number of bits of the prefix (called N) is a parameter of the integer representation.
    // If the integer value is small enough, i.e., strictly less than 2N-1, it is compressed within the N-bit prefix.
    // ...
    // The prefix size, N, is always between 1 and 8 bits. An integer
    // starting at an octet boundary will have an 8-bit prefix.

    // Technically, such integers can be of any size, but as we do not have arbitrary-long integers,
    // everything that does not fit into 'dst' we consider as an error (after all, try to allocate a string
    // of such size and ... hehehe - send it as a part of a header!

    // This function updates the offset _only_ if the read was successful.
    if (offset >= bitLength()) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    const quint32 prefixLen = 8 - offset % 8;
    const quint32 fullPrefix = (1 << prefixLen) - 1;

    const uchar prefix = uchar(first[offset / 8] & fullPrefix);
    if (prefix < fullPrefix) {
        // The number fitted into the prefix bits.
        dst = prefix;
        offset += prefixLen;
        return true;
    }

    quint32 newOffset = offset + prefixLen;
    // We have a list of bytes representing an integer ...
    quint64 val = prefix;
    quint32 octetPower = 0;

    while (true) {
        if (newOffset >= bitLength()) {
            setError(Error::NotEnoughData);
            return false;
        }

        const uchar octet = first[newOffset / 8];

        if (octetPower == 28 && octet > 15) {
            qCritical("integer is too big");
            setError(Error::InvalidInteger);
            return false;
        }

        val += quint32(octet & 0x7f) << octetPower;
        newOffset += 8;

        if (!(octet & 0x80)) {
            // The most significant bit of each octet is used
            // as a continuation flag: its value is set to 1
            // except for the last octet in the list.
            break;
        }

        octetPower += 7;
    }

    dst = val;
    offset = newOffset;
    Q_ASSERT(!(offset % 8));

    return true;
}